

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

bool djgm_export_obj_triangles(djg_mesh *mesh,char *filename)

{
  float fVar1;
  float fVar2;
  float fVar3;
  djgm_vertex *pdVar4;
  FILE *__s;
  uint uVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if (mesh == (djg_mesh *)0x0) {
    __assert_fail("mesh",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x739,"bool djgm_export_obj_triangles(const djg_mesh *, const char *)");
  }
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    fwrite("djg_error: fopen failed\n",0x18,1,_stdout);
    fflush(_stdout);
  }
  else {
    fwrite("# Created by the DJGM library (see dj_opengl.h)\n\n",0x31,1,__s);
    fwrite("# Vertices\n",0xb,1,__s);
    if (0 < mesh->vertexc) {
      lVar6 = 0x38;
      lVar7 = 0;
      do {
        pdVar4 = mesh->vertexv;
        fVar8 = *(float *)((long)pdVar4 + lVar6 + -0x18);
        fVar9 = *(float *)((long)pdVar4 + lVar6 + -0x14);
        fVar10 = *(float *)((long)&(pdVar4->p).x + lVar6);
        fVar1 = *(float *)((long)pdVar4 + lVar6 + -0x10);
        fVar2 = *(float *)((long)pdVar4 + lVar6 + -4);
        fVar11 = fVar9 * fVar10 - fVar2 * fVar1;
        fVar3 = *(float *)((long)pdVar4 + lVar6 + -8);
        fVar10 = fVar1 * fVar3 - fVar10 * fVar8;
        fVar9 = fVar8 * fVar2 - fVar3 * fVar9;
        fVar8 = fVar9 * fVar9 + fVar11 * fVar11 + fVar10 * fVar10;
        if (fVar8 < 0.0) {
          fVar8 = sqrtf(fVar8);
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        if (fVar8 <= 0.0) {
          __assert_fail("nrm > 0.0f && \"Invalid normal\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                        ,0x750,"bool djgm_export_obj_triangles(const djg_mesh *, const char *)");
        }
        fprintf(__s,"v %f %f %f\n",(double)*(float *)((long)pdVar4 + lVar6 + -0x38),
                (double)*(float *)((long)pdVar4 + lVar6 + -0x34),
                (double)*(float *)((long)pdVar4 + lVar6 + -0x30));
        fprintf(__s,"vn %f %f %f\n",(double)(fVar11 / fVar8),(double)(fVar10 / fVar8),
                (double)(fVar9 / fVar8));
        fprintf(__s,"vt %f %f\n",(double)*(float *)((long)pdVar4 + lVar6 + -0x28),
                (double)*(float *)((long)pdVar4 + lVar6 + -0x24));
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x40;
      } while (lVar7 < mesh->vertexc);
    }
    fwrite("# Topology\n",0xb,1,__s);
    if (2 < mesh->poly3c) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        uVar5 = *(ushort *)((long)mesh->poly3v + lVar6) + 1;
        fprintf(__s,"f %i/%i/%i ",(ulong)uVar5,(ulong)uVar5,(ulong)uVar5);
        uVar5 = *(ushort *)((long)mesh->poly3v + lVar6 + 2) + 1;
        fprintf(__s,"%i/%i/%i ",(ulong)uVar5,(ulong)uVar5,(ulong)uVar5);
        uVar5 = *(ushort *)((long)mesh->poly3v + lVar6 + 4) + 1;
        fprintf(__s,"%i/%i/%i\n",(ulong)uVar5,(ulong)uVar5,(ulong)uVar5);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 6;
      } while (lVar7 < mesh->poly3c / 3);
    }
    fclose(__s);
  }
  return __s != (FILE *)0x0;
}

Assistant:

DJGDEF bool
djgm_export_obj_triangles(const djg_mesh *mesh, const char *filename)
{
    DJG_ASSERT(mesh);
    int i;
    FILE *pf;

    pf = fopen(filename, "w");
    if (!pf) {
        DJG_LOG("djg_error: fopen failed\n");
        return false;
    }
    fprintf(pf, "# Created by the DJGM library (see dj_opengl.h)\n\n");

    // write vertices
    fprintf(pf, "# Vertices\n");
    for (i = 0; i < mesh->vertexc; ++i) {
        const djgm_vertex *v = &mesh->vertexv[i];
        float n[3], nrm;

        // compute the normal from tangent cross product
        n[0] = v->dpds.y * v->dpdt.z - v->dpds.z * v->dpdt.y;
        n[1] = v->dpds.z * v->dpdt.x - v->dpds.x * v->dpdt.z;
        n[2] = v->dpds.x * v->dpdt.y - v->dpds.y * v->dpdt.x;
        nrm = sqrtf(n[0] * n[0] + n[1] * n[1] + n[2] * n[2]);

        DJG_ASSERT(nrm > 0.0f && "Invalid normal");
        fprintf(pf, "v %f %f %f\n", v->p.x, v->p.y, v->p.z);
        fprintf(pf, "vn %f %f %f\n", n[0] / nrm, n[1] / nrm, n[2] / nrm);
        fprintf(pf, "vt %f %f\n", v->st.s, v->st.t);
    }

    // write topology
    fprintf(pf, "# Topology\n");
    for (i = 0; i < mesh->poly3c / 3; ++i) {
        fprintf(pf, "f %i/%i/%i ", (int32_t)mesh->poly3v[3*i  ] + 1,
                                   (int32_t)mesh->poly3v[3*i  ] + 1,
                                   (int32_t)mesh->poly3v[3*i  ] + 1);
        fprintf(pf, "%i/%i/%i ", (int32_t)mesh->poly3v[3*i+1] + 1,
                                 (int32_t)mesh->poly3v[3*i+1] + 1,
                                 (int32_t)mesh->poly3v[3*i+1] + 1);
        fprintf(pf, "%i/%i/%i\n", (int32_t)mesh->poly3v[3*i+2] + 1,
                                  (int32_t)mesh->poly3v[3*i+2] + 1,
                                  (int32_t)mesh->poly3v[3*i+2] + 1);
    }

    fclose(pf);

    return true;
}